

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::lsplit_path
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,libtorrent *this,string_view p)

{
  bool bVar1;
  const_reference pvVar2;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  size_type sep;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined1 local_18 [8];
  string_view p_local;
  
  p_local._M_len = p._M_len;
  local_18 = (undefined1  [8])this;
  bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_18);
  if (bVar1) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&sep);
    ::std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_28,
               (basic_string_view<char,_std::char_traits<char>_> *)&sep);
  }
  else {
    pvVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_18);
    if (*pvVar2 == '/') {
      ::std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)local_18,1);
    }
    local_40 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_18,'/',0);
    if (local_40 == 0xffffffffffffffff) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50);
      ::std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
                (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)local_18
                 ,&local_50);
    }
    else {
      local_60 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_18,0,local_40)
      ;
      local_70 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_18,
                            local_40 + 1,0xffffffffffffffff);
      ::std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__,&local_60,&local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> lsplit_path(string_view p)
	{
		if (p.empty()) return {{}, {}};
		// for absolute paths, skip the initial "/"
		if (p.front() == TORRENT_SEPARATOR_CHAR) p.remove_prefix(1);
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		else if (p.front() == '/') p.remove_prefix(1);
#endif
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		auto const sep = p.find_first_of("/\\");
#else
		auto const sep = p.find_first_of(TORRENT_SEPARATOR_CHAR);
#endif
		if (sep == string_view::npos) return {p, {}};
		return { p.substr(0, sep), p.substr(sep + 1) };
	}